

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_h_predictor_16x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  int y_mask;
  uint uVar39;
  short sVar40;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  undefined1 auVar41 [16];
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ushort uVar59;
  ushort uVar60;
  ushort uVar65;
  ushort uVar67;
  ushort uVar69;
  ushort uVar71;
  ushort uVar73;
  ushort uVar75;
  undefined1 auVar61 [16];
  ushort uVar66;
  ushort uVar68;
  ushort uVar70;
  ushort uVar72;
  ushort uVar74;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ushort uVar79;
  ushort uVar80;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  undefined1 auVar81 [16];
  ushort uVar94;
  ushort uVar95;
  
  auVar41 = pshuflw(ZEXT116(top_row[0xf]),ZEXT116(top_row[0xf]),0);
  sVar47 = auVar41._0_2_;
  sVar48 = auVar41._2_2_;
  uVar1 = *(ulong *)left_column;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7._12_3_ = auVar3._12_3_;
  auVar11._8_2_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11[10] = (char)(uVar1 >> 0x28);
  auVar11._11_4_ = auVar7._11_4_;
  auVar15._8_2_ = 0;
  auVar15._0_8_ = uVar1;
  auVar15._10_5_ = auVar11._10_5_;
  auVar19[8] = (char)(uVar1 >> 0x20);
  auVar19._0_8_ = uVar1;
  auVar19._9_6_ = auVar15._9_6_;
  auVar27._7_8_ = 0;
  auVar27._0_7_ = auVar19._8_7_;
  auVar31._1_8_ = SUB158(auVar27 << 0x40,7);
  auVar31[0] = (char)(uVar1 >> 0x18);
  auVar31._9_6_ = 0;
  auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
  auVar32[0] = (char)(uVar1 >> 0x10);
  auVar32._11_4_ = 0;
  auVar26[2] = (char)(uVar1 >> 8);
  auVar26._0_2_ = (ushort)uVar1;
  auVar26._3_12_ = SUB1512(auVar32 << 0x20,3);
  auVar41._0_2_ = (ushort)uVar1 & 0xff;
  auVar41._2_13_ = auVar26._2_13_;
  auVar41[0xf] = 0;
  sVar49 = sVar47 + 0x80;
  sVar50 = sVar48 * 0x1f + 0x80;
  sVar51 = sVar47 * 0x3c + 0x80;
  sVar52 = sVar48 * 0x56 + 0x80;
  sVar53 = sVar47 * 0x6f + 0x80;
  sVar54 = sVar48 * 0x85 + 0x80;
  sVar55 = sVar47 * 0x9a + 0x80;
  sVar56 = sVar48 * 0xac + 0x80;
  sVar40 = sVar47 * 0xbc + 0x80;
  sVar42 = sVar48 * 0xca + 0x80;
  sVar43 = sVar47 * 0xd5 + 0x80;
  sVar44 = sVar48 * 0xdf + 0x80;
  sVar45 = sVar47 * 0xe6 + 0x80;
  sVar46 = sVar48 * 0xec + 0x80;
  sVar47 = sVar47 * 0xef + 0x80;
  sVar48 = sVar48 * 0xf0 + 0x80;
  for (uVar39 = 0x1000100; uVar39 < 0xf0e0f0f; uVar39 = uVar39 + 0x2020202) {
    auVar61._4_4_ = uVar39;
    auVar61._0_4_ = uVar39;
    auVar61._8_4_ = uVar39;
    auVar61._12_4_ = uVar39;
    auVar81 = pshufb(auVar41,auVar61);
    uVar59 = auVar81._0_2_ * 0xff + sVar49;
    uVar65 = auVar81._2_2_ * 0xe1 + sVar50;
    uVar67 = auVar81._4_2_ * 0xc4 + sVar51;
    uVar69 = auVar81._6_2_ * 0xaa + sVar52;
    uVar71 = auVar81._8_2_ * 0x91 + sVar53;
    uVar73 = auVar81._10_2_ * 0x7b + sVar54;
    uVar75 = auVar81._12_2_ * 0x66 + sVar55;
    uVar77 = auVar81._14_2_ * 0x54 + sVar56;
    uVar60 = uVar59 >> 8;
    uVar66 = uVar65 >> 8;
    uVar68 = uVar67 >> 8;
    uVar70 = uVar69 >> 8;
    uVar72 = uVar71 >> 8;
    uVar74 = uVar73 >> 8;
    uVar76 = uVar75 >> 8;
    uVar78 = uVar77 >> 8;
    uVar79 = auVar81._0_2_ * 0x44 + sVar40;
    uVar82 = auVar81._2_2_ * 0x36 + sVar42;
    uVar84 = auVar81._4_2_ * 0x2b + sVar43;
    uVar86 = auVar81._6_2_ * 0x21 + sVar44;
    uVar88 = auVar81._8_2_ * 0x1a + sVar45;
    uVar90 = auVar81._10_2_ * 0x14 + sVar46;
    uVar92 = auVar81._12_2_ * 0x11 + sVar47;
    uVar94 = auVar81._14_2_ * 0x10 + sVar48;
    uVar80 = uVar79 >> 8;
    uVar83 = uVar82 >> 8;
    uVar85 = uVar84 >> 8;
    uVar87 = uVar86 >> 8;
    uVar89 = uVar88 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    *dst = (uVar60 != 0) * (uVar60 < 0x100) * (char)(uVar59 >> 8) - (0xff < uVar60);
    dst[1] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
    dst[2] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar68);
    dst[3] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
    dst[4] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
    dst[5] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
    dst[6] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    dst[7] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    dst[8] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    dst[9] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
    dst[10] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    dst[0xb] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    dst[0xc] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    dst[0xd] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    dst[0xe] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    dst[0xf] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    dst = dst + stride;
  }
  uVar1 = *(ulong *)(left_column + 8);
  auVar4._8_6_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xe] = (char)(uVar1 >> 0x38);
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8[0xc] = (char)(uVar1 >> 0x30);
  auVar8._13_2_ = auVar4._13_2_;
  auVar12._8_4_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._12_3_ = auVar8._12_3_;
  auVar16._8_2_ = 0;
  auVar16._0_8_ = uVar1;
  auVar16[10] = (char)(uVar1 >> 0x28);
  auVar16._11_4_ = auVar12._11_4_;
  auVar20._8_2_ = 0;
  auVar20._0_8_ = uVar1;
  auVar20._10_5_ = auVar16._10_5_;
  auVar23[8] = (char)(uVar1 >> 0x20);
  auVar23._0_8_ = uVar1;
  auVar23._9_6_ = auVar20._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar23._8_7_;
  auVar33._1_8_ = SUB158(auVar28 << 0x40,7);
  auVar33[0] = (char)(uVar1 >> 0x18);
  auVar33._9_6_ = 0;
  auVar34._1_10_ = SUB1510(auVar33 << 0x30,5);
  auVar34[0] = (char)(uVar1 >> 0x10);
  auVar34._11_4_ = 0;
  auVar81._3_12_ = SUB1512(auVar34 << 0x20,3);
  auVar81[2] = (char)(uVar1 >> 8);
  auVar81[0] = (byte)uVar1;
  auVar81[1] = 0;
  auVar81[0xf] = 0;
  for (uVar39 = 0x1000100; uVar39 < 0xf0e0f0f; uVar39 = uVar39 + 0x2020202) {
    auVar62._4_4_ = uVar39;
    auVar62._0_4_ = uVar39;
    auVar62._8_4_ = uVar39;
    auVar62._12_4_ = uVar39;
    auVar41 = pshufb(auVar81,auVar62);
    uVar59 = auVar41._0_2_ * 0xff + sVar49;
    uVar65 = auVar41._2_2_ * 0xe1 + sVar50;
    uVar67 = auVar41._4_2_ * 0xc4 + sVar51;
    uVar69 = auVar41._6_2_ * 0xaa + sVar52;
    uVar71 = auVar41._8_2_ * 0x91 + sVar53;
    uVar73 = auVar41._10_2_ * 0x7b + sVar54;
    uVar75 = auVar41._12_2_ * 0x66 + sVar55;
    uVar77 = auVar41._14_2_ * 0x54 + sVar56;
    uVar60 = uVar59 >> 8;
    uVar66 = uVar65 >> 8;
    uVar68 = uVar67 >> 8;
    uVar70 = uVar69 >> 8;
    uVar72 = uVar71 >> 8;
    uVar74 = uVar73 >> 8;
    uVar76 = uVar75 >> 8;
    uVar78 = uVar77 >> 8;
    uVar79 = auVar41._0_2_ * 0x44 + sVar40;
    uVar82 = auVar41._2_2_ * 0x36 + sVar42;
    uVar84 = auVar41._4_2_ * 0x2b + sVar43;
    uVar86 = auVar41._6_2_ * 0x21 + sVar44;
    uVar88 = auVar41._8_2_ * 0x1a + sVar45;
    uVar90 = auVar41._10_2_ * 0x14 + sVar46;
    uVar92 = auVar41._12_2_ * 0x11 + sVar47;
    uVar94 = auVar41._14_2_ * 0x10 + sVar48;
    uVar80 = uVar79 >> 8;
    uVar83 = uVar82 >> 8;
    uVar85 = uVar84 >> 8;
    uVar87 = uVar86 >> 8;
    uVar89 = uVar88 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    *dst = (uVar60 != 0) * (uVar60 < 0x100) * (char)(uVar59 >> 8) - (0xff < uVar60);
    dst[1] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
    dst[2] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar68);
    dst[3] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
    dst[4] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
    dst[5] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
    dst[6] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    dst[7] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    dst[8] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    dst[9] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
    dst[10] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    dst[0xb] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    dst[0xc] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    dst[0xd] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    dst[0xe] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    dst[0xf] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    dst = dst + stride;
  }
  uVar1 = *(ulong *)(left_column + 0x10);
  auVar5._8_6_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[0xe] = (char)(uVar1 >> 0x38);
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[0xc] = (char)(uVar1 >> 0x30);
  auVar9._13_2_ = auVar5._13_2_;
  auVar13._8_4_ = 0;
  auVar13._0_8_ = uVar1;
  auVar13._12_3_ = auVar9._12_3_;
  auVar17._8_2_ = 0;
  auVar17._0_8_ = uVar1;
  auVar17[10] = (char)(uVar1 >> 0x28);
  auVar17._11_4_ = auVar13._11_4_;
  auVar21._8_2_ = 0;
  auVar21._0_8_ = uVar1;
  auVar21._10_5_ = auVar17._10_5_;
  auVar24[8] = (char)(uVar1 >> 0x20);
  auVar24._0_8_ = uVar1;
  auVar24._9_6_ = auVar21._9_6_;
  auVar29._7_8_ = 0;
  auVar29._0_7_ = auVar24._8_7_;
  auVar35._1_8_ = SUB158(auVar29 << 0x40,7);
  auVar35[0] = (char)(uVar1 >> 0x18);
  auVar35._9_6_ = 0;
  auVar36._1_10_ = SUB1510(auVar35 << 0x30,5);
  auVar36[0] = (char)(uVar1 >> 0x10);
  auVar36._11_4_ = 0;
  auVar57._3_12_ = SUB1512(auVar36 << 0x20,3);
  auVar57[2] = (char)(uVar1 >> 8);
  auVar57[0] = (byte)uVar1;
  auVar57[1] = 0;
  auVar57[0xf] = 0;
  for (uVar39 = 0x1000100; uVar39 < 0xf0e0f0f; uVar39 = uVar39 + 0x2020202) {
    auVar63._4_4_ = uVar39;
    auVar63._0_4_ = uVar39;
    auVar63._8_4_ = uVar39;
    auVar63._12_4_ = uVar39;
    auVar41 = pshufb(auVar57,auVar63);
    uVar59 = auVar41._0_2_ * 0xff + sVar49;
    uVar65 = auVar41._2_2_ * 0xe1 + sVar50;
    uVar67 = auVar41._4_2_ * 0xc4 + sVar51;
    uVar69 = auVar41._6_2_ * 0xaa + sVar52;
    uVar71 = auVar41._8_2_ * 0x91 + sVar53;
    uVar73 = auVar41._10_2_ * 0x7b + sVar54;
    uVar75 = auVar41._12_2_ * 0x66 + sVar55;
    uVar77 = auVar41._14_2_ * 0x54 + sVar56;
    uVar60 = uVar59 >> 8;
    uVar66 = uVar65 >> 8;
    uVar68 = uVar67 >> 8;
    uVar70 = uVar69 >> 8;
    uVar72 = uVar71 >> 8;
    uVar74 = uVar73 >> 8;
    uVar76 = uVar75 >> 8;
    uVar78 = uVar77 >> 8;
    uVar79 = auVar41._0_2_ * 0x44 + sVar40;
    uVar82 = auVar41._2_2_ * 0x36 + sVar42;
    uVar84 = auVar41._4_2_ * 0x2b + sVar43;
    uVar86 = auVar41._6_2_ * 0x21 + sVar44;
    uVar88 = auVar41._8_2_ * 0x1a + sVar45;
    uVar90 = auVar41._10_2_ * 0x14 + sVar46;
    uVar92 = auVar41._12_2_ * 0x11 + sVar47;
    uVar94 = auVar41._14_2_ * 0x10 + sVar48;
    uVar80 = uVar79 >> 8;
    uVar83 = uVar82 >> 8;
    uVar85 = uVar84 >> 8;
    uVar87 = uVar86 >> 8;
    uVar89 = uVar88 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    *dst = (uVar60 != 0) * (uVar60 < 0x100) * (char)(uVar59 >> 8) - (0xff < uVar60);
    dst[1] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
    dst[2] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar68);
    dst[3] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
    dst[4] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
    dst[5] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
    dst[6] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    dst[7] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    dst[8] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    dst[9] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
    dst[10] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    dst[0xb] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    dst[0xc] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    dst[0xd] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    dst[0xe] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    dst[0xf] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    dst = dst + stride;
  }
  uVar1 = *(ulong *)(left_column + 0x18);
  auVar6._8_6_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[0xe] = (char)(uVar1 >> 0x38);
  auVar10._8_4_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[0xc] = (char)(uVar1 >> 0x30);
  auVar10._13_2_ = auVar6._13_2_;
  auVar14._8_4_ = 0;
  auVar14._0_8_ = uVar1;
  auVar14._12_3_ = auVar10._12_3_;
  auVar18._8_2_ = 0;
  auVar18._0_8_ = uVar1;
  auVar18[10] = (char)(uVar1 >> 0x28);
  auVar18._11_4_ = auVar14._11_4_;
  auVar22._8_2_ = 0;
  auVar22._0_8_ = uVar1;
  auVar22._10_5_ = auVar18._10_5_;
  auVar25[8] = (char)(uVar1 >> 0x20);
  auVar25._0_8_ = uVar1;
  auVar25._9_6_ = auVar22._9_6_;
  auVar30._7_8_ = 0;
  auVar30._0_7_ = auVar25._8_7_;
  auVar37._1_8_ = SUB158(auVar30 << 0x40,7);
  auVar37[0] = (char)(uVar1 >> 0x18);
  auVar37._9_6_ = 0;
  auVar38._1_10_ = SUB1510(auVar37 << 0x30,5);
  auVar38[0] = (char)(uVar1 >> 0x10);
  auVar38._11_4_ = 0;
  auVar58._3_12_ = SUB1512(auVar38 << 0x20,3);
  auVar58[2] = (char)(uVar1 >> 8);
  auVar58[0] = (byte)uVar1;
  auVar58[1] = 0;
  auVar58[0xf] = 0;
  for (uVar39 = 0x1000100; uVar39 < 0xf0e0f0f; uVar39 = uVar39 + 0x2020202) {
    auVar64._4_4_ = uVar39;
    auVar64._0_4_ = uVar39;
    auVar64._8_4_ = uVar39;
    auVar64._12_4_ = uVar39;
    auVar41 = pshufb(auVar58,auVar64);
    uVar59 = auVar41._0_2_ * 0xff + sVar49;
    uVar65 = auVar41._2_2_ * 0xe1 + sVar50;
    uVar67 = auVar41._4_2_ * 0xc4 + sVar51;
    uVar69 = auVar41._6_2_ * 0xaa + sVar52;
    uVar71 = auVar41._8_2_ * 0x91 + sVar53;
    uVar73 = auVar41._10_2_ * 0x7b + sVar54;
    uVar75 = auVar41._12_2_ * 0x66 + sVar55;
    uVar77 = auVar41._14_2_ * 0x54 + sVar56;
    uVar60 = uVar59 >> 8;
    uVar66 = uVar65 >> 8;
    uVar68 = uVar67 >> 8;
    uVar70 = uVar69 >> 8;
    uVar72 = uVar71 >> 8;
    uVar74 = uVar73 >> 8;
    uVar76 = uVar75 >> 8;
    uVar78 = uVar77 >> 8;
    uVar79 = auVar41._0_2_ * 0x44 + sVar40;
    uVar82 = auVar41._2_2_ * 0x36 + sVar42;
    uVar84 = auVar41._4_2_ * 0x2b + sVar43;
    uVar86 = auVar41._6_2_ * 0x21 + sVar44;
    uVar88 = auVar41._8_2_ * 0x1a + sVar45;
    uVar90 = auVar41._10_2_ * 0x14 + sVar46;
    uVar92 = auVar41._12_2_ * 0x11 + sVar47;
    uVar94 = auVar41._14_2_ * 0x10 + sVar48;
    uVar80 = uVar79 >> 8;
    uVar83 = uVar82 >> 8;
    uVar85 = uVar84 >> 8;
    uVar87 = uVar86 >> 8;
    uVar89 = uVar88 >> 8;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    *dst = (uVar60 != 0) * (uVar60 < 0x100) * (char)(uVar59 >> 8) - (0xff < uVar60);
    dst[1] = (uVar66 != 0) * (uVar66 < 0x100) * (char)(uVar65 >> 8) - (0xff < uVar66);
    dst[2] = (uVar68 != 0) * (uVar68 < 0x100) * (char)(uVar67 >> 8) - (0xff < uVar68);
    dst[3] = (uVar70 != 0) * (uVar70 < 0x100) * (char)(uVar69 >> 8) - (0xff < uVar70);
    dst[4] = (uVar72 != 0) * (uVar72 < 0x100) * (char)(uVar71 >> 8) - (0xff < uVar72);
    dst[5] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
    dst[6] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
    dst[7] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
    dst[8] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
    dst[9] = (uVar83 != 0) * (uVar83 < 0x100) * (char)(uVar82 >> 8) - (0xff < uVar83);
    dst[10] = (uVar85 != 0) * (uVar85 < 0x100) * (char)(uVar84 >> 8) - (0xff < uVar85);
    dst[0xb] = (uVar87 != 0) * (uVar87 < 0x100) * (char)(uVar86 >> 8) - (0xff < uVar87);
    dst[0xc] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    dst[0xd] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    dst[0xe] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    dst[0xf] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    dst = dst + stride;
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_16x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[15]);
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi16(LoadLo8(left_column));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 16));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 24));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    dst += stride;
  }
}